

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O3

UBool icu_63::Transliterator::initializeRegistry(UErrorCode *status)

{
  undefined8 uVar1;
  UnicodeString *pUVar2;
  int32_t iVar3;
  TransliteratorRegistry *pTVar4;
  UResourceBundle *resB;
  char *pcVar5;
  UResourceBundle *resB_00;
  UChar *pUVar6;
  Transliterator *adoptedProto;
  Transliterator *adoptedProto_00;
  Transliterator *adoptedProto_01;
  Transliterator *adoptedProto_02;
  Transliterator *this;
  NameUnicodeTransliterator *this_00;
  undefined4 uVar7;
  UBool UVar8;
  int32_t len;
  UErrorCode *in_RSI;
  undefined8 uVar9;
  undefined4 length;
  int indexR;
  uint uVar10;
  bool visible;
  UChar type;
  int32_t len_1;
  UErrorCode status_1;
  int32_t len_2;
  UnicodeString id;
  UnicodeString T_PART;
  undefined1 local_21a [26];
  int32_t local_200;
  undefined4 uStack_1fc;
  undefined4 local_1f8;
  int32_t local_1f4;
  ConstChar16Ptr local_1f0;
  ConstChar16Ptr local_1e8;
  ConstChar16Ptr local_1e0;
  ConstChar16Ptr local_1d8;
  ConstChar16Ptr local_1d0;
  ConstChar16Ptr local_1c8;
  ConstChar16Ptr local_1c0;
  ConstChar16Ptr local_1b8;
  ConstChar16Ptr local_1b0;
  UnicodeString local_1a8;
  UnicodeString local_168;
  UObject local_128;
  UChar *local_120;
  UResourceBundle *local_118;
  char16_t *local_110;
  char16_t *local_108;
  char16_t *local_f0;
  char16_t *local_e8;
  char16_t *local_d0;
  char16_t *local_c8;
  UChar *local_b0;
  UChar *local_a0;
  UChar *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  if (registry != (TransliteratorRegistry *)0x0) {
    return '\x01';
  }
  pTVar4 = (TransliteratorRegistry *)UMemory::operator_new((UMemory *)0x108,(size_t)in_RSI);
  if (pTVar4 == (TransliteratorRegistry *)0x0) {
    registry = (TransliteratorRegistry *)0x0;
LAB_00275095:
    UMemory::operator_delete((UMemory *)pTVar4,in_RSI);
    registry = (TransliteratorRegistry *)0x0;
    return '\0';
  }
  in_RSI = status;
  TransliteratorRegistry::TransliteratorRegistry(pTVar4,status);
  registry = pTVar4;
  if (U_ZERO_ERROR < *status) {
    TransliteratorRegistry::~TransliteratorRegistry(pTVar4);
    goto LAB_00275095;
  }
  local_118 = ures_open_63("icudt63l-translit",(char *)0x0,status);
  local_21a._2_8_ =
       ures_getByKey_63(local_118,"RuleBasedTransliteratorIDs",(UResourceBundle *)0x0,status);
  local_1b0.p_ = L"-t-";
  uVar9 = (UnicodeString *)0x1;
  icu_63::UnicodeString::UnicodeString(&local_70,'\x01',&local_1b0,-1);
  local_80 = local_1b0.p_;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar3 = ures_getSize_63((UResourceBundle *)local_21a._2_8_);
    local_200 = iVar3;
    if (0 < iVar3) {
      local_128._vptr_UObject = (_func_int **)&PTR__UnicodeString_00487e70;
      pUVar2 = (UnicodeString *)0x0;
      do {
        uVar9 = pUVar2;
        indexR = (int)uVar9;
        resB = ures_getByIndex_63((UResourceBundle *)local_21a._2_8_,indexR,(UResourceBundle *)0x0,
                                  status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          pcVar5 = ures_getKey_63(resB);
          icu_63::UnicodeString::UnicodeString(&local_168,pcVar5,-1,kInvariant);
          uVar7 = local_70.fUnion.fFields.fLength;
          if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
            uVar7 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          length = local_168.fUnion.fFields.fLength;
          if (-1 < local_168.fUnion.fStackFields.fLengthAndFlags) {
            length = (int)local_168.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if (((((int)local_70.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) || ((int)uVar7 < 0))
             || (uVar7 == 0)) {
LAB_0027521f:
            resB_00 = ures_getNextResource_63(resB,(UResourceBundle *)0x0,status);
            pcVar5 = ures_getKey_63(resB_00);
            uVar9 = local_21a;
            u_charsToUChars_63(pcVar5,(UChar *)uVar9,1);
            if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
              local_21a._14_4_ = 0;
              if (local_21a._0_2_ == 0x61) {
                local_1f0.p_ = ures_getString_63(resB_00,(int32_t *)(local_21a + 0xe),status);
                pTVar4 = registry;
                icu_63::UnicodeString::UnicodeString(&local_1a8,'\x01',&local_1f0,local_21a._14_4_);
                uVar9 = &local_168;
                TransliteratorRegistry::put
                          (pTVar4,(UnicodeString *)uVar9,&local_1a8,'\x01','\x01',status);
                icu_63::UnicodeString::~UnicodeString(&local_1a8);
                local_90 = local_1f0.p_;
              }
              else if ((local_21a._0_2_ == 0x66) || (local_21a._0_2_ == 0x69)) {
                local_120 = ures_getStringByKey_63
                                      (resB_00,"resource",(int32_t *)(local_21a + 0xe),status);
                visible = local_21a._0_2_ == 0x66;
                local_1a8.super_Replaceable.super_UObject._vptr_UObject =
                     (UObject)(UObject)local_128._vptr_UObject;
                local_1a8.fUnion.fStackFields.fLengthAndFlags = 2;
                local_1f4 = 0;
                pUVar6 = ures_getStringByKey_63(resB_00,"direction",&local_1f4,status);
                if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                  local_21a._18_8_ = pUVar6;
                  icu_63::UnicodeString::setTo
                            (&local_1a8,'\x01',(ConstChar16Ptr *)(local_21a + 0x12),local_1f4);
                  local_a0 = (UChar *)local_21a._18_8_;
                }
                else {
                  icu_63::UnicodeString::setToBogus(&local_1a8);
                }
                uVar7 = local_1a8.fUnion.fFields.fLength;
                if (-1 < local_1a8.fUnion.fStackFields.fLengthAndFlags) {
                  uVar7 = (int)local_1a8.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                if (uVar7 == 0) {
                  local_1f8 = UTRANS_REVERSE;
                }
                else {
                  uVar9 = local_1a8.fUnion.fStackFields.fBuffer;
                  if (((int)local_1a8.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
                    uVar9 = local_1a8.fUnion.fFields.fArray;
                  }
                  local_1f8 = ZEXT14(*(char16_t *)uVar9 != L'F');
                }
                icu_63::UnicodeString::~UnicodeString(&local_1a8);
                pTVar4 = registry;
                local_1e8.p_ = local_120;
                icu_63::UnicodeString::UnicodeString(&local_1a8,'\x01',&local_1e8,local_21a._14_4_);
                uVar9 = &local_168;
                TransliteratorRegistry::put
                          (pTVar4,(UnicodeString *)uVar9,&local_1a8,local_1f8,'\x01',visible,status)
                ;
                icu_63::UnicodeString::~UnicodeString(&local_1a8);
                local_b0 = local_1e8.p_;
              }
            }
            ures_close_63(resB_00);
            icu_63::UnicodeString::~UnicodeString(&local_168);
            goto LAB_0027545e;
          }
          uVar9 = local_70.fUnion.fStackFields.fBuffer;
          if ((local_70.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
            uVar9 = local_70.fUnion.fFields.fArray;
          }
          iVar3 = icu_63::UnicodeString::indexOf(&local_168,(UChar *)uVar9,0,uVar7,0,length);
          if (iVar3 == -1) goto LAB_0027521f;
          ures_close_63(resB);
          icu_63::UnicodeString::~UnicodeString(&local_168);
        }
        else {
LAB_0027545e:
          ures_close_63(resB);
        }
        uVar10 = indexR + 1;
        pUVar2 = (UnicodeString *)(ulong)uVar10;
      } while (local_200 != uVar10);
    }
  }
  ures_close_63((UResourceBundle *)local_21a._2_8_);
  ures_close_63(local_118);
  adoptedProto = (Transliterator *)UMemory::operator_new((UMemory *)0x58,uVar9);
  if (adoptedProto != (Transliterator *)0x0) {
    NullTransliterator::NullTransliterator((NullTransliterator *)adoptedProto);
  }
  adoptedProto_00 = (Transliterator *)UMemory::operator_new((UMemory *)0x60,uVar9);
  if (adoptedProto_00 != (Transliterator *)0x0) {
    LowercaseTransliterator::LowercaseTransliterator((LowercaseTransliterator *)adoptedProto_00);
  }
  adoptedProto_01 = (Transliterator *)UMemory::operator_new((UMemory *)0x60,uVar9);
  if (adoptedProto_01 != (Transliterator *)0x0) {
    UppercaseTransliterator::UppercaseTransliterator((UppercaseTransliterator *)adoptedProto_01);
  }
  adoptedProto_02 = (Transliterator *)UMemory::operator_new((UMemory *)0x60,uVar9);
  if (adoptedProto_02 != (Transliterator *)0x0) {
    TitlecaseTransliterator::TitlecaseTransliterator((TitlecaseTransliterator *)adoptedProto_02);
  }
  this = (Transliterator *)UMemory::operator_new((UMemory *)0x58,uVar9);
  if (this != (Transliterator *)0x0) {
    uVar9 = (UnicodeString *)0x0;
    UnicodeNameTransliterator::UnicodeNameTransliterator
              ((UnicodeNameTransliterator *)this,(UnicodeFilter *)0x0);
  }
  _local_200 = this;
  this_00 = (NameUnicodeTransliterator *)UMemory::operator_new((UMemory *)0xb0,uVar9);
  if (this_00 != (NameUnicodeTransliterator *)0x0) {
    uVar9 = (UnicodeString *)0x0;
    NameUnicodeTransliterator::NameUnicodeTransliterator(this_00,(UnicodeFilter *)0x0);
  }
  local_21a._2_8_ = UMemory::operator_new((UMemory *)0xa8,uVar9);
  if ((BreakTransliterator *)local_21a._2_8_ != (BreakTransliterator *)0x0) {
    uVar9 = (UnicodeString *)0x0;
    BreakTransliterator::BreakTransliterator
              ((BreakTransliterator *)local_21a._2_8_,(UnicodeFilter *)0x0);
    if ((((this_00 != (NameUnicodeTransliterator *)0x0) && (adoptedProto != (Transliterator *)0x0))
        && ((adoptedProto_00 != (Transliterator *)0x0 &&
            (((adoptedProto_01 != (Transliterator *)0x0 &&
              (adoptedProto_02 != (Transliterator *)0x0)) &&
             ((Transliterator *)_local_200 != (Transliterator *)0x0)))))) &&
       ((BreakTransliterator *)local_21a._2_8_ != (BreakTransliterator *)0x0)) {
      TransliteratorRegistry::put(registry,adoptedProto,'\x01',status);
      TransliteratorRegistry::put(registry,adoptedProto_00,'\x01',status);
      TransliteratorRegistry::put(registry,adoptedProto_01,'\x01',status);
      TransliteratorRegistry::put(registry,adoptedProto_02,'\x01',status);
      TransliteratorRegistry::put(registry,(Transliterator *)_local_200,'\x01',status);
      TransliteratorRegistry::put(registry,(Transliterator *)this_00,'\x01',status);
      TransliteratorRegistry::put(registry,(Transliterator *)local_21a._2_8_,'\0',status);
      RemoveTransliterator::registerIDs();
      EscapeTransliterator::registerIDs();
      UnescapeTransliterator::registerIDs();
      NormalizationTransliterator::registerIDs();
      AnyTransliterator::registerIDs();
      local_1b8.p_ = L"Null";
      icu_63::UnicodeString::UnicodeString(&local_168,'\x01',&local_1b8,-1);
      local_1c0.p_ = L"Null";
      icu_63::UnicodeString::UnicodeString(&local_1a8,'\x01',&local_1c0,-1);
      local_21a._18_8_ = local_21a._18_8_ & 0xffffffff00000000;
      TransliteratorIDParser::registerSpecialInverse
                (&local_168,&local_1a8,'\0',(UErrorCode *)(local_21a + 0x12));
      icu_63::UnicodeString::~UnicodeString(&local_1a8);
      local_c8 = local_1c0.p_;
      icu_63::UnicodeString::~UnicodeString(&local_168);
      local_d0 = local_1b8.p_;
      local_1c8.p_ = L"Upper";
      icu_63::UnicodeString::UnicodeString(&local_168,'\x01',&local_1c8,-1);
      local_1d0.p_ = L"Lower";
      icu_63::UnicodeString::UnicodeString(&local_1a8,'\x01',&local_1d0,-1);
      local_21a._18_8_ = local_21a._18_8_ & 0xffffffff00000000;
      TransliteratorIDParser::registerSpecialInverse
                (&local_168,&local_1a8,'\x01',(UErrorCode *)(local_21a + 0x12));
      icu_63::UnicodeString::~UnicodeString(&local_1a8);
      local_e8 = local_1d0.p_;
      icu_63::UnicodeString::~UnicodeString(&local_168);
      local_f0 = local_1c8.p_;
      local_1d8.p_ = L"Title";
      icu_63::UnicodeString::UnicodeString(&local_168,'\x01',&local_1d8,-1);
      local_1e0.p_ = L"Lower";
      icu_63::UnicodeString::UnicodeString(&local_1a8,'\x01',&local_1e0,-1);
      local_21a._18_8_ = local_21a._18_8_ & 0xffffffff00000000;
      TransliteratorIDParser::registerSpecialInverse
                (&local_168,&local_1a8,'\0',(UErrorCode *)(local_21a + 0x12));
      icu_63::UnicodeString::~UnicodeString(&local_1a8);
      local_108 = local_1e0.p_;
      icu_63::UnicodeString::~UnicodeString(&local_168);
      local_110 = local_1d8.p_;
      UVar8 = '\x01';
      ucln_i18n_registerCleanup_63(UCLN_I18N_TRANSLITERATOR,utrans_transliterator_cleanup_63);
      goto LAB_002758e3;
    }
  }
  if (adoptedProto != (Transliterator *)0x0) {
    (*(adoptedProto->super_UObject)._vptr_UObject[1])(adoptedProto);
  }
  if (adoptedProto_00 != (Transliterator *)0x0) {
    (*(adoptedProto_00->super_UObject)._vptr_UObject[1])(adoptedProto_00);
  }
  if (adoptedProto_01 != (Transliterator *)0x0) {
    (*(adoptedProto_01->super_UObject)._vptr_UObject[1])(adoptedProto_01);
  }
  uVar1 = local_21a._2_8_;
  if (adoptedProto_02 != (Transliterator *)0x0) {
    (*(adoptedProto_02->super_UObject)._vptr_UObject[1])(adoptedProto_02);
  }
  if ((Transliterator *)_local_200 != (Transliterator *)0x0) {
    (**(code **)(*(long *)_local_200 + 8))();
  }
  if (this_00 != (NameUnicodeTransliterator *)0x0) {
    (*(this_00->super_Transliterator).super_UObject._vptr_UObject[1])(this_00);
  }
  if ((BreakTransliterator *)uVar1 != (BreakTransliterator *)0x0) {
    (*(((Transliterator *)uVar1)->super_UObject)._vptr_UObject[1])(uVar1);
  }
  pTVar4 = registry;
  if (registry != (TransliteratorRegistry *)0x0) {
    TransliteratorRegistry::~TransliteratorRegistry(registry);
  }
  UMemory::operator_delete((UMemory *)pTVar4,(void *)uVar9);
  registry = (TransliteratorRegistry *)0x0;
  *status = U_MEMORY_ALLOCATION_ERROR;
  UVar8 = '\0';
LAB_002758e3:
  icu_63::UnicodeString::~UnicodeString(&local_70);
  return UVar8;
}

Assistant:

UBool Transliterator::initializeRegistry(UErrorCode &status) {
    if (registry != 0) {
        return TRUE;
    }

    registry = new TransliteratorRegistry(status);
    if (registry == 0 || U_FAILURE(status)) {
        delete registry;
        registry = 0;
        return FALSE; // can't create registry, no recovery
    }

    /* The following code parses the index table located in
     * icu/data/translit/root.txt.  The index is an n x 4 table
     * that follows this format:
     *  <id>{
     *      file{
     *          resource{"<resource>"}
     *          direction{"<direction>"}
     *      }
     *  }
     *  <id>{
     *      internal{
     *          resource{"<resource>"}
     *          direction{"<direction"}
     *       }
     *  }
     *  <id>{
     *      alias{"<getInstanceArg"}
     *  }
     * <id> is the ID of the system transliterator being defined.  These
     * are public IDs enumerated by Transliterator.getAvailableIDs(),
     * unless the second field is "internal".
     * 
     * <resource> is a ResourceReader resource name.  Currently these refer
     * to file names under com/ibm/text/resources.  This string is passed
     * directly to ResourceReader, together with <encoding>.
     * 
     * <direction> is either "FORWARD" or "REVERSE".
     * 
     * <getInstanceArg> is a string to be passed directly to
     * Transliterator.getInstance().  The returned Transliterator object
     * then has its ID changed to <id> and is returned.
     *
     * The extra blank field on "alias" lines is to make the array square.
     */
    //static const char translit_index[] = "translit_index";

    UResourceBundle *bundle, *transIDs, *colBund;
    bundle = ures_open(U_ICUDATA_TRANSLIT, NULL/*open default locale*/, &status);
    transIDs = ures_getByKey(bundle, RB_RULE_BASED_IDS, 0, &status);
    const UnicodeString T_PART = UNICODE_STRING_SIMPLE("-t-");

    int32_t row, maxRows;
    if (U_SUCCESS(status)) {
        maxRows = ures_getSize(transIDs);
        for (row = 0; row < maxRows; row++) {
            colBund = ures_getByIndex(transIDs, row, 0, &status);
            if (U_SUCCESS(status)) {
                UnicodeString id(ures_getKey(colBund), -1, US_INV);
                if(id.indexOf(T_PART) != -1) {
                    ures_close(colBund);
                    continue;
                }
                UResourceBundle* res = ures_getNextResource(colBund, NULL, &status);
                const char* typeStr = ures_getKey(res);
                UChar type;
                u_charsToUChars(typeStr, &type, 1);

                if (U_SUCCESS(status)) {
                    int32_t len = 0;
                    const UChar *resString;
                    switch (type) {
                    case 0x66: // 'f'
                    case 0x69: // 'i'
                        // 'file' or 'internal';
                        // row[2]=resource, row[3]=direction
                        {
                            
                            resString = ures_getStringByKey(res, "resource", &len, &status);
                            UBool visible = (type == 0x0066 /*f*/);
                            UTransDirection dir = 
                                (ures_getUnicodeStringByKey(res, "direction", &status).charAt(0) ==
                                 0x0046 /*F*/) ?
                                UTRANS_FORWARD : UTRANS_REVERSE;
                            registry->put(id, UnicodeString(TRUE, resString, len), dir, TRUE, visible, status);
                        }
                        break;
                    case 0x61: // 'a'
                        // 'alias'; row[2]=createInstance argument
                        resString = ures_getString(res, &len, &status);
                        registry->put(id, UnicodeString(TRUE, resString, len), TRUE, TRUE, status);
                        break;
                    }
                }
                ures_close(res);
            }
            ures_close(colBund);
        }
    }

    ures_close(transIDs);
    ures_close(bundle);

    // Manually add prototypes that the system knows about to the
    // cache.  This is how new non-rule-based transliterators are
    // added to the system.
    
    // This is to allow for null pointer check
    NullTransliterator* tempNullTranslit = new NullTransliterator();
    LowercaseTransliterator* tempLowercaseTranslit = new LowercaseTransliterator();
    UppercaseTransliterator* tempUppercaseTranslit = new UppercaseTransliterator();
    TitlecaseTransliterator* tempTitlecaseTranslit = new TitlecaseTransliterator();
    UnicodeNameTransliterator* tempUnicodeTranslit = new UnicodeNameTransliterator();
    NameUnicodeTransliterator* tempNameUnicodeTranslit = new NameUnicodeTransliterator();
#if !UCONFIG_NO_BREAK_ITERATION
     // TODO: could or should these transliterators be referenced polymorphically once constructed?
     BreakTransliterator* tempBreakTranslit         = new BreakTransliterator();
#endif
    // Check for null pointers
    if (tempNullTranslit == NULL || tempLowercaseTranslit == NULL || tempUppercaseTranslit == NULL ||
        tempTitlecaseTranslit == NULL || tempUnicodeTranslit == NULL || 
#if !UCONFIG_NO_BREAK_ITERATION
        tempBreakTranslit == NULL ||
#endif
        tempNameUnicodeTranslit == NULL )
    {
        delete tempNullTranslit;
        delete tempLowercaseTranslit;
        delete tempUppercaseTranslit;
        delete tempTitlecaseTranslit;
        delete tempUnicodeTranslit;
        delete tempNameUnicodeTranslit;
#if !UCONFIG_NO_BREAK_ITERATION
        delete tempBreakTranslit;
#endif
        // Since there was an error, remove registry
        delete registry;
        registry = NULL;

        status = U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }

    registry->put(tempNullTranslit, TRUE, status);
    registry->put(tempLowercaseTranslit, TRUE, status);
    registry->put(tempUppercaseTranslit, TRUE, status);
    registry->put(tempTitlecaseTranslit, TRUE, status);
    registry->put(tempUnicodeTranslit, TRUE, status);
    registry->put(tempNameUnicodeTranslit, TRUE, status);
#if !UCONFIG_NO_BREAK_ITERATION
    registry->put(tempBreakTranslit, FALSE, status);   // FALSE means invisible.
#endif

    RemoveTransliterator::registerIDs(); // Must be within mutex
    EscapeTransliterator::registerIDs();
    UnescapeTransliterator::registerIDs();
    NormalizationTransliterator::registerIDs();
    AnyTransliterator::registerIDs();

    _registerSpecialInverse(UNICODE_STRING_SIMPLE("Null"),
                            UNICODE_STRING_SIMPLE("Null"), FALSE);
    _registerSpecialInverse(UNICODE_STRING_SIMPLE("Upper"),
                            UNICODE_STRING_SIMPLE("Lower"), TRUE);
    _registerSpecialInverse(UNICODE_STRING_SIMPLE("Title"),
                            UNICODE_STRING_SIMPLE("Lower"), FALSE);

    ucln_i18n_registerCleanup(UCLN_I18N_TRANSLITERATOR, utrans_transliterator_cleanup);

    return TRUE;
}